

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O2

void __thiscall
Diligent::QueryBase<Diligent::EngineGLImplTraits>::OnBeginQuery
          (QueryBase<Diligent::EngineGLImplTraits> *this,DeviceContextImplType *pContext)

{
  QueryDesc *Args;
  DeviceContextImplType *pDVar1;
  char (*in_R8) [61];
  string msg;
  string local_40;
  
  Args = &(this->
          super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
          ).m_Desc;
  if ((this->
      super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>)
      .m_Desc.Type == QUERY_TYPE_TIMESTAMP) {
    FormatString<char[49],char_const*,char[39]>
              (&local_40,(Diligent *)"BeginQuery cannot be called on timestamp query \'",
               (char (*) [49])Args,(char **)"\'. Call EndQuery to set the timestamp.",
               (char (*) [39])in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"OnBeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
               ,0x83);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (this->m_State == Querying) {
    FormatString<char[28],char_const*,char[61]>
              (&local_40,(Diligent *)"Attempting to begin query \'",(char (*) [28])Args,
               (char **)"\' twice. A query must be ended before it can be begun again.",in_R8);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"OnBeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
               ,0x87);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pDVar1 = (this->m_pContext).m_pObject;
  if (pDVar1 != pContext && pDVar1 != (DeviceContextImplType *)0x0) {
    (**(code **)((long)(this->
                       super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                       ).super_ObjectBase<Diligent::IQueryGL>.
                       super_RefCountedObject<Diligent::IQueryGL>.super_IQueryGL.super_IQuery.
                       super_IDeviceObject.super_IObject + 0x48))(this);
  }
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator=(&this->m_pContext,pContext);
  this->m_State = Querying;
  return;
}

Assistant:

void OnBeginQuery(DeviceContextImplType* pContext)
    {
        DEV_CHECK_ERR(this->m_Desc.Type != QUERY_TYPE_TIMESTAMP,
                      "BeginQuery cannot be called on timestamp query '", this->m_Desc.Name,
                      "'. Call EndQuery to set the timestamp.");

        DEV_CHECK_ERR(m_State != QueryState::Querying,
                      "Attempting to begin query '", this->m_Desc.Name,
                      "' twice. A query must be ended before it can be begun again.");

        if (m_pContext != nullptr && m_pContext != pContext)
            Invalidate();

        m_pContext = pContext;
        m_State    = QueryState::Querying;
    }